

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O3

wchar_t scp_get_sink_action(scp_sink_action *act)

{
  strbuf *psVar1;
  StripCtrlChars *pSVar2;
  _Bool _Var3;
  int iVar4;
  size_t sVar5;
  fxp_name *pfVar6;
  sftp_request *psVar7;
  sftp_packet *psVar8;
  char *pcVar9;
  fxp_handle *handle;
  fxp_names *names;
  scp_sftp_dirstack *psVar10;
  fxp_name *pfVar11;
  char *pcVar12;
  size_t sVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  char *fmt;
  undefined8 *puVar17;
  FILE *pFVar18;
  int iVar19;
  long lVar20;
  byte bVar21;
  ptrlen str;
  ptrlen str_00;
  ptrlen str_01;
  ptrlen str_02;
  ptrlen str_03;
  ptrlen str_04;
  ptrlen str_05;
  size_t namesize;
  fxp_attrs attrs;
  fxp_name *local_98;
  size_t local_90;
  size_t local_88;
  fxp_name *local_80;
  scp_sftp_dirstack *local_78;
  fxp_handle *local_70;
  fxp_attrs local_68;
  
  psVar10 = scp_sftp_dirstack_head;
  bVar21 = 0;
  if (!using_sftp) {
    act->settime = false;
    strbuf_shrink_to(act->buf,0);
    _Var3 = ssh_scp_recv(&local_88,1);
    if (!_Var3) {
      return L'\x01';
    }
    do {
      bVar21 = (byte)local_88;
      if ((byte)local_88 == 10) {
        pcVar9 = "Protocol error: Unexpected newline";
        goto LAB_00110ab0;
      }
      while( true ) {
        _Var3 = ssh_scp_recv(&local_88,1);
        pSVar2 = string_scc;
        if (!_Var3) {
          pcVar9 = "Lost connection";
          goto LAB_00110ab0;
        }
        if ((byte)local_88 == '\n') break;
        BinarySink_put_byte(act->buf->binarysink_,(byte)local_88);
      }
      if (bVar21 < 0x43) {
        if (bVar21 != 1) {
          if (bVar21 == 2) {
            pcVar9 = act->buf->s;
            sVar5 = strlen(pcVar9);
            str_01.len = sVar5;
            str_01.ptr = pcVar9;
            pcVar9 = stripctrl_string_ptrlen(pSVar2,str_01);
            if (pcVar9 != (char *)0x0) {
              bump("%s",pcVar9);
            }
LAB_00110601:
            (*backend->vt->send)(backend,anon_var_dwarf_3405d + 10,1);
            act->action = L'\x03';
            return L'\0';
          }
          goto LAB_00110ac0;
        }
        pcVar9 = act->buf->s;
        sVar5 = strlen(pcVar9);
        str.len = sVar5;
        str.ptr = pcVar9;
        pcVar9 = stripctrl_string_ptrlen(pSVar2,str);
        if (pcVar9 != (char *)0x0) {
          tell_user(_stderr,"%s",pcVar9);
          safefree(pcVar9);
        }
        errs = errs + L'\x01';
      }
      else {
        if (bVar21 != 0x54) {
          if (bVar21 - 0x43 < 2) {
            act->action = (uint)(bVar21 != 0x43) + L'\x01';
            if ((bVar21 == 0x43) || (recursive != '\0')) {
              iVar19 = __isoc99_sscanf(act->buf->s,"%lo %lu %n",&act->permissions,&act->size,
                                       &local_68);
              if (iVar19 == 2) {
                act->name = act->buf->s + (int)(uint)local_68.flags;
                return L'\0';
              }
              pcVar9 = "Protocol error: Illegal file descriptor format";
            }
            else {
              pcVar9 = 
              "security violation: remote host attempted to create a subdirectory in a non-recursive copy!"
              ;
            }
            goto LAB_00110ab0;
          }
          if (bVar21 == 0x45) goto LAB_00110601;
LAB_00110ac0:
          pcVar9 = "Protocol error: Expected control record";
LAB_00110ab0:
          bump(pcVar9);
        }
        iVar19 = __isoc99_sscanf(act->buf->s,"%lu %*d %lu %*d",&act->mtime,&act->atime);
        if (iVar19 != 2) {
          pcVar9 = "Protocol error: Illegal time format";
          goto LAB_00110ab0;
        }
        act->settime = true;
        (*backend->vt->send)(backend,anon_var_dwarf_3405d + 10,1);
        strbuf_shrink_to(act->buf,0);
      }
      _Var3 = ssh_scp_recv(&local_88,1);
      if (!_Var3) {
        return L'\x01';
      }
    } while( true );
  }
  if (scp_sftp_dirstack_head == (scp_sftp_dirstack *)0x0) {
    if (scp_sftp_donethistarget != '\0') {
      return L'\x01';
    }
    scp_sftp_donethistarget = '\x01';
    pfVar6 = (fxp_name *)scp_sftp_remotepath;
  }
  else {
    iVar19 = scp_sftp_dirstack_head->namepos;
    iVar15 = scp_sftp_dirstack_head->namelen;
    if (iVar19 < iVar15) {
      do {
        pcVar9 = psVar10->names[iVar19].filename;
        sVar5 = strspn(pcVar9,".");
        if (pcVar9[sVar5] != '\0') {
          if (psVar10->wildcard == (char *)0x0) break;
          iVar4 = wc_match(psVar10->wildcard,pcVar9);
          iVar19 = psVar10->namepos;
          iVar15 = psVar10->namelen;
          if (iVar4 != 0) break;
        }
        iVar19 = iVar19 + 1;
        psVar10->namepos = iVar19;
      } while (iVar19 < iVar15);
    }
    if (iVar15 <= iVar19) {
      pcVar9 = psVar10->wildcard;
      if (pcVar9 == (char *)0x0) {
        act->action = L'\x03';
      }
      else {
        act->action = L'\x04';
        if (psVar10->matched_something == false) {
          tell_user(_stderr,"pscp: wildcard \'%s\' matched no files");
          errs = errs + L'\x01';
          pcVar9 = psVar10->wildcard;
        }
        safefree(pcVar9);
      }
      safefree(psVar10->dirpath);
      safefree(psVar10->names);
      scp_sftp_dirstack_head = psVar10->next;
      safefree(psVar10);
      return L'\0';
    }
    psVar10->matched_something = true;
    psVar10->namepos = iVar19 + 1;
    pfVar6 = (fxp_name *)dupcat_fn(psVar10->dirpath,"/",psVar10->names[iVar19].filename,0);
  }
  psVar7 = fxp_stat_send((char *)pfVar6);
  psVar8 = sftp_wait_for_reply(psVar7);
  _Var3 = fxp_stat_recv(psVar8,psVar7,&local_68);
  pSVar2 = string_scc;
  if ((_Var3) && (((uint)local_68.flags & 4) != 0)) {
    local_80 = pfVar6;
    if ((local_68.permissions._1_1_ & 0x40) == 0) {
      act->action = L'\x01';
      _Var3 = false;
      strbuf_shrink_to(act->buf,0);
      psVar1 = act->buf;
      pcVar9 = stripslashes((char *)pfVar6,false);
      BinarySink_put_asciz(psVar1->binarysink_,pcVar9);
      act->name = act->buf->s;
      act->size = -(ulong)(((uint)local_68.flags & 1) == 0) | local_68.size;
      act->permissions =
           (ulong)(CONCAT11(local_68.permissions._1_1_,(undefined1)local_68.permissions) & 0xfff);
      if ((((uint)local_68.flags & 8) != 0) && (scp_sftp_preserve != false)) {
        act->atime = local_68.atime;
        act->mtime = local_68.mtime;
        _Var3 = true;
      }
      act->settime = _Var3;
      if (psVar10 != (scp_sftp_dirstack *)0x0) {
        scp_sftp_currentname = (char *)local_80;
        return L'\0';
      }
      scp_sftp_currentname = dupstr((char *)local_80);
      return L'\0';
    }
    if ((scp_sftp_recursive == false) && (scp_sftp_wildcard == (char *)0x0)) {
      sVar5 = strlen((char *)pfVar6);
      str_02.len = sVar5;
      str_02.ptr = pfVar6;
      pcVar9 = stripctrl_string_ptrlen(pSVar2,str_02);
      if (pcVar9 != (char *)0x0) {
        tell_user(_stderr,"pscp: %s: is a directory",pcVar9);
        safefree(pcVar9);
      }
      errs = errs + L'\x01';
      if (psVar10 != (scp_sftp_dirstack *)0x0) {
        safefree(pfVar6);
      }
      if (scp_sftp_dirstack_head == (scp_sftp_dirstack *)0x0) {
        return L'\x01';
      }
LAB_00110a0a:
      act->action = L'\x04';
      return L'\0';
    }
    psVar7 = fxp_opendir_send((char *)pfVar6);
    psVar8 = sftp_wait_for_reply(psVar7);
    handle = fxp_opendir_recv(psVar8,psVar7);
    pSVar2 = string_scc;
    if (handle == (fxp_handle *)0x0) {
      sVar5 = strlen((char *)pfVar6);
      str_04.len = sVar5;
      str_04.ptr = pfVar6;
      pcVar9 = stripctrl_string_ptrlen(pSVar2,str_04);
      pFVar18 = _stderr;
      if (pcVar9 != (char *)0x0) {
        pcVar12 = fxp_error();
        fmt = "pscp: unable to open directory %s: %s";
        goto LAB_00110556;
      }
      goto LAB_00110565;
    }
    local_78 = psVar10;
    local_88 = 0;
    psVar7 = fxp_readdir_send(handle);
    psVar8 = sftp_wait_for_reply(psVar7);
    names = fxp_readdir_recv(psVar8,psVar7);
    if (names == (fxp_names *)0x0) {
      local_90 = 0;
      local_98 = (fxp_name *)0x0;
    }
    else {
      local_98 = (fxp_name *)0x0;
      local_90 = 0;
      local_70 = handle;
      do {
        if ((long)names->nnames == 0) {
          fxp_free_names(names);
          goto LAB_00110976;
        }
        local_98 = (fxp_name *)
                   safegrowarray(local_98,&local_88,0x48,local_90,(long)names->nnames,false);
        if (0 < names->nnames) {
          lVar16 = 0;
          lVar20 = 0;
          do {
            pcVar9 = *(char **)((long)&names->names->filename + lVar16);
            if ((*pcVar9 != '.') ||
               ((pcVar9[1] != '\0' && ((pcVar9[1] != '.' || (pcVar9[2] != '\0')))))) {
              _Var3 = vet_filename(pcVar9);
              pSVar2 = string_scc;
              if (_Var3) {
                sVar13 = local_90 + 1;
                puVar17 = (undefined8 *)((long)&names->names->filename + lVar16);
                pfVar6 = local_98 + local_90;
                for (lVar14 = 9; local_90 = sVar13, lVar14 != 0; lVar14 = lVar14 + -1) {
                  pfVar6->filename = (char *)*puVar17;
                  puVar17 = puVar17 + (ulong)bVar21 * -2 + 1;
                  pfVar6 = (fxp_name *)((long)pfVar6 + (ulong)bVar21 * -0x10 + 8);
                }
              }
              else {
                pcVar9 = *(char **)((long)&names->names->filename + lVar16);
                sVar5 = strlen(pcVar9);
                str_03.len = sVar5;
                str_03.ptr = pcVar9;
                pcVar9 = stripctrl_string_ptrlen(pSVar2,str_03);
                if (pcVar9 != (char *)0x0) {
                  tell_user(_stderr,"ignoring potentially dangerous server-supplied filename \'%s\'"
                            ,pcVar9);
                  safefree(pcVar9);
                }
              }
            }
            lVar20 = lVar20 + 1;
            lVar16 = lVar16 + 0x48;
          } while (lVar20 < names->nnames);
        }
        names->nnames = 0;
        fxp_free_names(names);
        handle = local_70;
        psVar7 = fxp_readdir_send(local_70);
        psVar8 = sftp_wait_for_reply(psVar7);
        names = fxp_readdir_recv(psVar8,psVar7);
        pfVar6 = local_80;
      } while (names != (fxp_names *)0x0);
    }
    iVar19 = fxp_error_type();
    pSVar2 = string_scc;
    if (iVar19 == 1) {
LAB_00110976:
      psVar7 = fxp_close_send(handle);
      psVar8 = sftp_wait_for_reply(psVar7);
      fxp_close_recv(psVar8,psVar7);
      psVar10 = (scp_sftp_dirstack *)safemalloc(1,0x30,0);
      psVar10->next = scp_sftp_dirstack_head;
      psVar10->names = local_98;
      psVar10->namepos = 0;
      psVar10->namelen = (int)local_90;
      pfVar11 = pfVar6;
      if (local_78 == (scp_sftp_dirstack *)0x0) {
        pfVar11 = (fxp_name *)dupstr((char *)pfVar6);
      }
      psVar10->dirpath = (char *)pfVar11;
      pcVar9 = scp_sftp_wildcard;
      scp_sftp_dirstack_head = psVar10;
      if (scp_sftp_wildcard == (char *)0x0) {
        psVar10->wildcard = (char *)0x0;
        act->action = L'\x02';
        strbuf_shrink_to(act->buf,0);
        psVar1 = act->buf;
        pcVar9 = stripslashes((char *)pfVar6,false);
        BinarySink_put_asciz(psVar1->binarysink_,pcVar9);
        act->name = act->buf->s;
        act->size = 0;
        act->permissions =
             (ulong)(CONCAT11(local_68.permissions._1_1_,(undefined1)local_68.permissions) & 0xfff);
        if ((scp_sftp_preserve == true) && (((uint)local_68.flags & 8) != 0)) {
          act->atime = local_68.atime;
          act->mtime = local_68.mtime;
          act->settime = true;
          return L'\0';
        }
        act->settime = false;
        return L'\0';
      }
      psVar10->matched_something = false;
      scp_sftp_wildcard = (char *)0x0;
      psVar10->wildcard = pcVar9;
      goto LAB_00110a0a;
    }
    sVar5 = strlen((char *)pfVar6);
    str_05.len = sVar5;
    str_05.ptr = pfVar6;
    pcVar9 = stripctrl_string_ptrlen(pSVar2,str_05);
    psVar10 = local_78;
    pFVar18 = _stderr;
    if (pcVar9 != (char *)0x0) {
      pcVar12 = fxp_error();
      tell_user(pFVar18,"pscp: reading directory %s: %s",pcVar9,pcVar12);
      safefree(pcVar9);
    }
    psVar7 = fxp_close_send(handle);
    psVar8 = sftp_wait_for_reply(psVar7);
    fxp_close_recv(psVar8,psVar7);
    if (psVar10 != (scp_sftp_dirstack *)0x0) {
      safefree(local_80);
    }
  }
  else {
    sVar5 = strlen((char *)pfVar6);
    str_00.len = sVar5;
    str_00.ptr = pfVar6;
    pcVar9 = stripctrl_string_ptrlen(pSVar2,str_00);
    pFVar18 = _stderr;
    if (pcVar9 != (char *)0x0) {
      if (_Var3) {
        pcVar12 = "file type not supplied";
      }
      else {
        pcVar12 = fxp_error();
      }
      fmt = "unable to identify %s: %s";
LAB_00110556:
      tell_user(pFVar18,fmt,pcVar9,pcVar12);
      safefree(pcVar9);
    }
LAB_00110565:
    local_98 = pfVar6;
    if (psVar10 == (scp_sftp_dirstack *)0x0) goto LAB_00110572;
  }
  safefree(local_98);
LAB_00110572:
  errs = errs + L'\x01';
  return L'\x01';
}

Assistant:

int scp_get_sink_action(struct scp_sink_action *act)
{
    if (using_sftp) {
        char *fname;
        bool must_free_fname;
        struct fxp_attrs attrs;
        struct sftp_packet *pktin;
        struct sftp_request *req;
        bool ret;

        if (!scp_sftp_dirstack_head) {
            if (!scp_sftp_donethistarget) {
                /*
                 * Simple case: we are only dealing with one file.
                 */
                fname = scp_sftp_remotepath;
                must_free_fname = false;
                scp_sftp_donethistarget = true;
            } else {
                /*
                 * Even simpler case: one file _which we've done_.
                 * Return 1 (finished).
                 */
                return 1;
            }
        } else {
            /*
             * We're now in the middle of stepping through a list
             * of names returned from fxp_readdir(); so let's carry
             * on.
             */
            struct scp_sftp_dirstack *head = scp_sftp_dirstack_head;
            while (head->namepos < head->namelen &&
                   (is_dots(head->names[head->namepos].filename) ||
                    (head->wildcard &&
                     !wc_match(head->wildcard,
                               head->names[head->namepos].filename))))
                head->namepos++;       /* skip . and .. */
            if (head->namepos < head->namelen) {
                head->matched_something = true;
                fname = dupcat(head->dirpath, "/",
                               head->names[head->namepos++].filename);
                must_free_fname = true;
            } else {
                /*
                 * We've come to the end of the list; pop it off
                 * the stack and return an ENDDIR action (or RETRY
                 * if this was a wildcard match).
                 */
                if (head->wildcard) {
                    act->action = SCP_SINK_RETRY;
                    if (!head->matched_something) {
                        tell_user(stderr, "pscp: wildcard '%s' matched "
                                  "no files", head->wildcard);
                        errs++;
                    }
                    sfree(head->wildcard);

                } else {
                    act->action = SCP_SINK_ENDDIR;
                }

                sfree(head->dirpath);
                sfree(head->names);
                scp_sftp_dirstack_head = head->next;
                sfree(head);

                return 0;
            }
        }

        /*
         * Now we have a filename. Stat it, and see if it's a file
         * or a directory.
         */
        req = fxp_stat_send(fname);
        pktin = sftp_wait_for_reply(req);
        ret = fxp_stat_recv(pktin, req, &attrs);

        if (!ret || !(attrs.flags & SSH_FILEXFER_ATTR_PERMISSIONS)) {
            with_stripctrl(san, fname)
                tell_user(stderr, "unable to identify %s: %s", san,
                          ret ? "file type not supplied" : fxp_error());
            if (must_free_fname) sfree(fname);
            errs++;
            return 1;
        }

        if (attrs.permissions & 0040000) {
            struct scp_sftp_dirstack *newitem;
            struct fxp_handle *dirhandle;
            size_t nnames, namesize;
            struct fxp_name *ournames;
            struct fxp_names *names;

            /*
             * It's a directory. If we're not in recursive mode,
             * this merits a complaint (which is fatal if the name
             * was specified directly, but not if it was matched by
             * a wildcard).
             *
             * We skip this complaint completely if
             * scp_sftp_wildcard is set, because that's an
             * indication that we're not actually supposed to
             * _recursively_ transfer the dir, just scan it for
             * things matching the wildcard.
             */
            if (!scp_sftp_recursive && !scp_sftp_wildcard) {
                with_stripctrl(san, fname)
                    tell_user(stderr, "pscp: %s: is a directory", san);
                errs++;
                if (must_free_fname) sfree(fname);
                if (scp_sftp_dirstack_head) {
                    act->action = SCP_SINK_RETRY;
                    return 0;
                } else {
                    return 1;
                }
            }

            /*
             * Otherwise, the fun begins. We must fxp_opendir() the
             * directory, slurp the filenames into memory, return
             * SCP_SINK_DIR (unless this is a wildcard match), and
             * set targetisdir. The next time we're called, we will
             * run through the list of filenames one by one,
             * matching them against a wildcard if present.
             *
             * If targetisdir is _already_ set (meaning we're
             * already in the middle of going through another such
             * list), we must push the other (target,namelist) pair
             * on a stack.
             */
            req = fxp_opendir_send(fname);
            pktin = sftp_wait_for_reply(req);
            dirhandle = fxp_opendir_recv(pktin, req);

            if (!dirhandle) {
                with_stripctrl(san, fname)
                    tell_user(stderr, "pscp: unable to open directory %s: %s",
                              san, fxp_error());
                if (must_free_fname) sfree(fname);
                errs++;
                return 1;
            }
            nnames = namesize = 0;
            ournames = NULL;
            while (1) {
                int i;

                req = fxp_readdir_send(dirhandle);
                pktin = sftp_wait_for_reply(req);
                names = fxp_readdir_recv(pktin, req);

                if (names == NULL) {
                    if (fxp_error_type() == SSH_FX_EOF)
                        break;
                    with_stripctrl(san, fname)
                        tell_user(stderr, "pscp: reading directory %s: %s",
                                  san, fxp_error());

                    req = fxp_close_send(dirhandle);
                    pktin = sftp_wait_for_reply(req);
                    fxp_close_recv(pktin, req);

                    if (must_free_fname) sfree(fname);
                    sfree(ournames);
                    errs++;
                    return 1;
                }
                if (names->nnames == 0) {
                    fxp_free_names(names);
                    break;
                }
                sgrowarrayn(ournames, namesize, nnames, names->nnames);
                for (i = 0; i < names->nnames; i++) {
                    if (!strcmp(names->names[i].filename, ".") ||
                        !strcmp(names->names[i].filename, "..")) {
                        /*
                         * . and .. are normal consequences of
                         * reading a directory, and aren't worth
                         * complaining about.
                         */
                    } else if (!vet_filename(names->names[i].filename)) {
                        with_stripctrl(san, names->names[i].filename)
                            tell_user(stderr, "ignoring potentially dangerous "
                                      "server-supplied filename '%s'", san);
                    } else
                        ournames[nnames++] = names->names[i];
                }
                names->nnames = 0;             /* prevent free_names */
                fxp_free_names(names);
            }
            req = fxp_close_send(dirhandle);
            pktin = sftp_wait_for_reply(req);
            fxp_close_recv(pktin, req);

            newitem = snew(struct scp_sftp_dirstack);
            newitem->next = scp_sftp_dirstack_head;
            newitem->names = ournames;
            newitem->namepos = 0;
            newitem->namelen = nnames;
            if (must_free_fname)
                newitem->dirpath = fname;
            else
                newitem->dirpath = dupstr(fname);
            if (scp_sftp_wildcard) {
                newitem->wildcard = scp_sftp_wildcard;
                newitem->matched_something = false;
                scp_sftp_wildcard = NULL;
            } else {
                newitem->wildcard = NULL;
            }
            scp_sftp_dirstack_head = newitem;

            if (newitem->wildcard) {
                act->action = SCP_SINK_RETRY;
            } else {
                act->action = SCP_SINK_DIR;
                strbuf_clear(act->buf);
                put_asciz(act->buf, stripslashes(fname, false));
                act->name = act->buf->s;
                act->size = 0;     /* duhh, it's a directory */
                act->permissions = 07777 & attrs.permissions;
                if (scp_sftp_preserve &&
                    (attrs.flags & SSH_FILEXFER_ATTR_ACMODTIME)) {
                    act->atime = attrs.atime;
                    act->mtime = attrs.mtime;
                    act->settime = true;
                } else
                    act->settime = false;
            }
            return 0;

        } else {
            /*
             * It's a file. Return SCP_SINK_FILE.
             */
            act->action = SCP_SINK_FILE;
            strbuf_clear(act->buf);
            put_asciz(act->buf, stripslashes(fname, false));
            act->name = act->buf->s;
            if (attrs.flags & SSH_FILEXFER_ATTR_SIZE) {
                act->size = attrs.size;
            } else
                act->size = UINT64_MAX;   /* no idea */
            act->permissions = 07777 & attrs.permissions;
            if (scp_sftp_preserve &&
                (attrs.flags & SSH_FILEXFER_ATTR_ACMODTIME)) {
                act->atime = attrs.atime;
                act->mtime = attrs.mtime;
                act->settime = true;
            } else
                act->settime = false;
            if (must_free_fname)
                scp_sftp_currentname = fname;
            else
                scp_sftp_currentname = dupstr(fname);
            return 0;
        }

    } else {
        bool done = false;
        int action;
        char ch;

        act->settime = false;
        strbuf_clear(act->buf);

        while (!done) {
            if (!ssh_scp_recv(&ch, 1))
                return 1;
            if (ch == '\n')
                bump("Protocol error: Unexpected newline");
            action = ch;
            while (1) {
                if (!ssh_scp_recv(&ch, 1))
                    bump("Lost connection");
                if (ch == '\n')
                    break;
                put_byte(act->buf, ch);
            }
            switch (action) {
              case '\01':                      /* error */
                with_stripctrl(san, act->buf->s)
                    tell_user(stderr, "%s", san);
                errs++;
                continue;                      /* go round again */
              case '\02':                      /* fatal error */
                with_stripctrl(san, act->buf->s)
                    bump("%s", san);
              case 'E':
                backend_send(backend, "", 1);
                act->action = SCP_SINK_ENDDIR;
                return 0;
              case 'T':
                if (sscanf(act->buf->s, "%lu %*d %lu %*d",
                           &act->mtime, &act->atime) == 2) {
                    act->settime = true;
                    backend_send(backend, "", 1);
                    strbuf_clear(act->buf);
                    continue;          /* go round again */
                }
                bump("Protocol error: Illegal time format");
              case 'C':
              case 'D':
                act->action = (action == 'C' ? SCP_SINK_FILE : SCP_SINK_DIR);
                if (act->action == SCP_SINK_DIR && !recursive) {
                    bump("security violation: remote host attempted to create "
                         "a subdirectory in a non-recursive copy!");
                }
                break;
              default:
                bump("Protocol error: Expected control record");
            }
            /*
             * We will go round this loop only once, unless we hit
             * `continue' above.
             */
            done = true;
        }

        /*
         * If we get here, we must have seen SCP_SINK_FILE or
         * SCP_SINK_DIR.
         */
        {
            int i;
            if (sscanf(act->buf->s, "%lo %"SCNu64" %n", &act->permissions,
                       &act->size, &i) != 2)
                bump("Protocol error: Illegal file descriptor format");
            act->name = act->buf->s + i;
            return 0;
        }
    }
}